

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

unsigned_long_long strpool_inject(strpool_t *pool,char *string,int length)

{
  int iVar1;
  unsigned_long_long uVar2;
  long lVar3;
  int *piVar4;
  char *data;
  uint *puStack_68;
  int data_size;
  strpool_internal_entry_t *entry;
  int handle_index;
  int slot_base_1;
  uint slot_hash_1;
  int handle_index_1;
  strpool_internal_entry_t *entry_1;
  uint local_40;
  int index;
  int slot_base;
  uint slot_hash;
  int first_free;
  int slot;
  int base_count;
  int base_slot;
  uint hash;
  int length_local;
  char *string_local;
  strpool_t *pool_local;
  
  if ((string == (char *)0x0) || (length < 0)) {
    pool_local = (strpool_t *)0x0;
  }
  else {
    base_slot = length;
    _hash = string;
    string_local = (char *)pool;
    base_count = strpool_internal_find_in_blocks(pool,string,length);
    if (base_count == 0) {
      base_count = strpool_internal_calculate_hash(_hash,base_slot,*(int *)(string_local + 8));
    }
    slot_base = base_count & *(int *)(string_local + 0x38) - 1U;
    first_free = *(int *)(*(long *)(string_local + 0x30) + (long)slot_base * 0xc + 8);
    slot_hash = slot_base;
    slot = slot_base;
    while (0 < first_free) {
      index = *(uint *)(*(long *)(string_local + 0x30) + (long)(int)slot_hash * 0xc);
      if ((index == 0) && (*(int *)(*(long *)(string_local + 0x30) + (long)slot_base * 0xc) != 0)) {
        slot_base = slot_hash;
      }
      local_40 = index & *(int *)(string_local + 0x38) - 1U;
      if (local_40 == slot) {
        if (first_free < 1) {
          __assert_fail("base_count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                        ,0x3b9,"unsigned long long strpool_inject(strpool_t *, const char *, int)");
        }
        first_free = first_free + -1;
        if (index == base_count) {
          entry_1._4_4_ = *(int *)(*(long *)(string_local + 0x30) + (long)(int)slot_hash * 0xc + 4);
          _slot_hash_1 = *(long *)(string_local + 0x40) + (long)entry_1._4_4_ * 0x20;
          if ((*(int *)(_slot_hash_1 + 0x14) == base_slot) &&
             (((*(int *)(string_local + 8) == 0 &&
               (iVar1 = memcmp((void *)(*(long *)(_slot_hash_1 + 8) + 8),_hash,(long)base_slot),
               iVar1 == 0)) ||
              ((*(int *)(string_local + 8) != 0 &&
               (iVar1 = strncasecmp((char *)(*(long *)(_slot_hash_1 + 8) + 8),_hash,(long)base_slot)
               , iVar1 == 0)))))) {
            slot_base_1 = *(int *)(_slot_hash_1 + 4);
            uVar2 = strpool_internal_make_handle
                              (slot_base_1,
                               *(int *)(*(long *)(string_local + 0x50) + 4 + (long)slot_base_1 * 8),
                               *(unsigned_long_long *)(string_local + 0x18),
                               *(int *)(string_local + 0xc),
                               *(unsigned_long_long *)(string_local + 0x10));
            return uVar2;
          }
        }
      }
      slot_hash = slot_hash + 1 & *(int *)(string_local + 0x38) - 1U;
    }
    if (*(int *)(string_local + 0x38) - *(int *)(string_local + 0x38) / 3 <=
        *(int *)(string_local + 0x4c)) {
      strpool_internal_expand_hash_table((strpool_t *)string_local);
      slot = base_count & *(int *)(string_local + 0x38) - 1U;
      slot_base = slot;
      slot_hash = slot;
      while (first_free != 0) {
        handle_index = *(uint *)(*(long *)(string_local + 0x30) + (long)(int)slot_hash * 0xc);
        if ((handle_index == 0) &&
           (*(int *)(*(long *)(string_local + 0x30) + (long)slot_base * 0xc) != 0)) {
          slot_base = slot_hash;
        }
        entry._4_4_ = handle_index & *(int *)(string_local + 0x38) - 1U;
        if (entry._4_4_ == slot) {
          first_free = first_free + -1;
        }
        slot_hash = slot_hash + 1 & *(int *)(string_local + 0x38) - 1U;
      }
    }
    slot_hash = slot_base;
    while (*(int *)(*(long *)(string_local + 0x30) + (long)(int)slot_hash * 0xc) != 0) {
      slot_hash = slot_hash + 1 & *(int *)(string_local + 0x38) - 1U;
    }
    if (*(int *)(string_local + 0x48) <= *(int *)(string_local + 0x4c)) {
      strpool_internal_expand_entries((strpool_t *)string_local);
    }
    if ((*(int *)(*(long *)(string_local + 0x30) + (long)(int)slot_hash * 0xc) != 0) ||
       ((base_count & *(int *)(string_local + 0x38) - 1U) != slot)) {
      __assert_fail("!pool->hash_table[ slot ].hash_key && ( hash & ( (unsigned int) pool->hash_capacity - 1 ) ) == (unsigned int) base_slot"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x3e9,"unsigned long long strpool_inject(strpool_t *, const char *, int)");
    }
    if (base_count == 0) {
      __assert_fail("hash",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x3ea,"unsigned long long strpool_inject(strpool_t *, const char *, int)");
    }
    *(int *)(*(long *)(string_local + 0x30) + (long)(int)slot_hash * 0xc) = base_count;
    *(undefined4 *)(*(long *)(string_local + 0x30) + (long)(int)slot_hash * 0xc + 4) =
         *(undefined4 *)(string_local + 0x4c);
    lVar3 = *(long *)(string_local + 0x30) + (long)slot * 0xc;
    *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
    if (*(int *)(string_local + 0x5c) < *(int *)(string_local + 0x58)) {
      entry._0_4_ = *(uint *)(string_local + 0x5c);
      *(undefined4 *)(*(long *)(string_local + 0x50) + 4 + (long)*(int *)(string_local + 0x5c) * 8)
           = 1;
      *(int *)(string_local + 0x5c) = *(int *)(string_local + 0x5c) + 1;
    }
    else if (*(int *)(string_local + 0x60) < 0) {
      strpool_internal_expand_handles((strpool_t *)string_local);
      entry._0_4_ = *(uint *)(string_local + 0x5c);
      *(undefined4 *)(*(long *)(string_local + 0x50) + 4 + (long)*(int *)(string_local + 0x5c) * 8)
           = 1;
      *(int *)(string_local + 0x5c) = *(int *)(string_local + 0x5c) + 1;
    }
    else {
      entry._0_4_ = *(uint *)(string_local + 0x60);
      if (*(int *)(string_local + 100) == *(int *)(string_local + 0x60)) {
        *(undefined4 *)(string_local + 100) =
             *(undefined4 *)
              (*(long *)(string_local + 0x50) + (long)*(int *)(string_local + 0x60) * 8);
      }
      *(undefined4 *)(string_local + 0x60) =
           *(undefined4 *)(*(long *)(string_local + 0x50) + (long)*(int *)(string_local + 0x60) * 8)
      ;
    }
    *(undefined4 *)(*(long *)(string_local + 0x50) + (long)(int)(uint)entry * 8) =
         *(undefined4 *)(string_local + 0x4c);
    puStack_68 = (uint *)(*(long *)(string_local + 0x40) +
                         (long)*(int *)(string_local + 0x4c) * 0x20);
    *(int *)(string_local + 0x4c) = *(int *)(string_local + 0x4c) + 1;
    data._4_4_ = base_slot + 9;
    piVar4 = (int *)strpool_internal_get_data_storage
                              ((strpool_t *)string_local,data._4_4_,(int *)((long)&data + 4));
    *puStack_68 = slot_hash;
    puStack_68[1] = (uint)entry;
    *(int **)(puStack_68 + 2) = piVar4;
    puStack_68[4] = data._4_4_;
    puStack_68[5] = base_slot;
    puStack_68[6] = 0;
    *piVar4 = base_count;
    piVar4[1] = base_slot;
    memcpy(piVar4 + 2,_hash,(long)base_slot);
    *(char *)((long)(piVar4 + 2) + (long)base_slot) = '\0';
    pool_local = (strpool_t *)
                 strpool_internal_make_handle
                           ((uint)entry,
                            *(int *)(*(long *)(string_local + 0x50) + 4 + (long)(int)(uint)entry * 8
                                    ),*(unsigned_long_long *)(string_local + 0x18),
                            *(int *)(string_local + 0xc),
                            *(unsigned_long_long *)(string_local + 0x10));
  }
  return (unsigned_long_long)pool_local;
}

Assistant:

STRPOOL_U64 strpool_inject( strpool_t* pool, char const* string, int length )
    {
    if( !string || length < 0 ) return 0;

    STRPOOL_U32 hash = strpool_internal_find_in_blocks( pool, string, length );
    // If no stored hash, calculate it from data
    if( !hash ) hash = strpool_internal_calculate_hash( string, length, pool->ignore_case ); 

    // Return handle to existing string, if it is already in pool
    int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
    int base_count = pool->hash_table[ base_slot ].base_count;
    int slot = base_slot;
    int first_free = slot;
    while( base_count > 0 )
        {
        STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
        if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
        int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        if( slot_base == base_slot ) 
            {
            STRPOOL_ASSERT( base_count > 0 );
            --base_count;
            if( slot_hash == hash )
                {
                int index = pool->hash_table[ slot ].entry_index;
                strpool_internal_entry_t* entry = &pool->entries[ index ];
                if( entry->length == length && 
                    ( 
                       ( !pool->ignore_case &&   STRPOOL_MEMCMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 )
                    || (  pool->ignore_case && STRPOOL_STRNICMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 ) 
                    ) 
                  )
                    {
                    int handle_index = entry->handle_index;
                    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, 
                        pool->index_mask, pool->counter_shift, pool->counter_mask );
                    }
                }
            }
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
        }   

    // This is a new string, so let's add it

    if( pool->entry_count >= ( pool->hash_capacity  - pool->hash_capacity / 3 ) )
        {
        strpool_internal_expand_hash_table( pool );

        base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        slot = base_slot;
        first_free = slot;
        while( base_count )
            {
            STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
            if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
            int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
            if( slot_base == base_slot )  --base_count;
            slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
            }       
        }
        
    slot = first_free;
    while( pool->hash_table[ slot ].hash_key )
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );

    if( pool->entry_count >= pool->entry_capacity )
        strpool_internal_expand_entries( pool );

    STRPOOL_ASSERT( !pool->hash_table[ slot ].hash_key && ( hash & ( (STRPOOL_U32) pool->hash_capacity - 1 ) ) == (STRPOOL_U32) base_slot );
    STRPOOL_ASSERT( hash );
    pool->hash_table[ slot ].hash_key = hash;
    pool->hash_table[ slot ].entry_index = pool->entry_count;
    ++pool->hash_table[ base_slot ].base_count;

    int handle_index;

    if( pool->handle_count < pool->handle_capacity )
        {
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }
    else if( pool->handle_freelist_head >= 0 )
        {
        handle_index = pool->handle_freelist_head;
        if( pool->handle_freelist_tail == pool->handle_freelist_head ) 
            pool->handle_freelist_tail = pool->handles[ pool->handle_freelist_head ].entry_index;
        pool->handle_freelist_head = pool->handles[ pool->handle_freelist_head ].entry_index;                       
        }
    else
        {
        strpool_internal_expand_handles( pool );
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }

    pool->handles[ handle_index ].entry_index = pool->entry_count;
        
    strpool_internal_entry_t* entry = &pool->entries[ pool->entry_count ];
    ++pool->entry_count;
        
    int data_size = length + 1 + (int) ( 2 * sizeof( STRPOOL_U32 ) );
    char* data = strpool_internal_get_data_storage( pool, data_size, &data_size );
    entry->hash_slot = slot;
    entry->handle_index = handle_index;
    entry->data = data;
    entry->size = data_size;
    entry->length = length;
    entry->refcount = 0;

    *(STRPOOL_U32*)(data) = hash;
    data += sizeof( STRPOOL_U32 );
    *(STRPOOL_U32*)(data) = (STRPOOL_U32) length;
    data += sizeof( STRPOOL_U32 );
    STRPOOL_MEMCPY( data, string, (size_t) length ); 
    data[ length ] = 0; // Ensure trailing zero

    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, pool->index_mask, 
        pool->counter_shift, pool->counter_mask );
    }